

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetAppleArchs
          (cmGeneratorTarget *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *archVec)

{
  char *__s;
  string defVarName;
  string sStack_58;
  string local_38;
  
  if (config->_M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_58,"OSX_ARCHITECTURES_",(allocator<char> *)&local_38);
    cmsys::SystemTools::UpperCase(&local_38,config);
    std::__cxx11::string::append((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    __s = GetProperty(this,&sStack_58);
    std::__cxx11::string::~string((string *)&sStack_58);
    if (__s != (char *)0x0) goto LAB_0028726b;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_58,"OSX_ARCHITECTURES",(allocator<char> *)&local_38);
  __s = GetProperty(this,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  if (__s == (char *)0x0) {
    return;
  }
LAB_0028726b:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_58,__s,(allocator<char> *)&local_38);
  cmSystemTools::ExpandListArgument(&sStack_58,archVec,false);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

void cmGeneratorTarget::GetAppleArchs(const std::string& config,
                                      std::vector<std::string>& archVec) const
{
  const char* archs = nullptr;
  if (!config.empty()) {
    std::string defVarName = "OSX_ARCHITECTURES_";
    defVarName += cmSystemTools::UpperCase(config);
    archs = this->GetProperty(defVarName);
  }
  if (!archs) {
    archs = this->GetProperty("OSX_ARCHITECTURES");
  }
  if (archs) {
    cmSystemTools::ExpandListArgument(std::string(archs), archVec);
  }
}